

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

string * slang::ast::formatWidth<slang::ast::StreamingConcatenationExpression>
                   (string *__return_storage_ptr__,StreamingConcatenationExpression *bitstream,
                   BitstreamSizeMode mode)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *extraout_RDX;
  size_t sVar1;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *extraout_RDX_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  char *pcVar2;
  pair<unsigned_long,_unsigned_long> *args;
  format_string<unsigned_long_&,_unsigned_long_&> fmt;
  format_string<unsigned_long_&> fmt_00;
  pair<unsigned_long,_unsigned_long> local_238;
  FormatBuffer buffer;
  
  buffer.buf.super_buffer<char>.ptr_ = buffer.buf.store_;
  buffer.buf.super_buffer<char>.size_ = 0;
  buffer.buf.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0046f6d8;
  buffer.buf.super_buffer<char>.capacity_ = 500;
  buffer.showColors = false;
  local_238 = dynamicBitstreamSize(bitstream,mode);
  args = (pair<unsigned_long,_unsigned_long> *)&local_238.second;
  if (local_238.first == 0) {
    sVar1 = 2;
    pcVar2 = "{}";
  }
  else {
    if (local_238.second != 0) {
      fmt.str_.size_ = 7;
      fmt.str_.data_ = "{}*n+{}";
      FormatBuffer::format<unsigned_long&,unsigned_long&>
                (&buffer,fmt,&local_238.first,(unsigned_long *)args);
      buf = extraout_RDX;
      goto LAB_001e12c4;
    }
    sVar1 = 4;
    pcVar2 = "{}*n";
    args = &local_238;
  }
  fmt_00.str_.size_ = sVar1;
  fmt_00.str_.data_ = pcVar2;
  FormatBuffer::format<unsigned_long&>(&buffer,fmt_00,&args->first);
  buf = extraout_RDX_00;
LAB_001e12c4:
  ::fmt::v9::to_string<char,500ul>(__return_storage_ptr__,(v9 *)&buffer,buf);
  ::fmt::v9::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&buffer.buf);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatWidth(const T& bitstream, BitstreamSizeMode mode) {
    FormatBuffer buffer;
    auto [multiplier, fixedSize] = dynamicBitstreamSize(bitstream, mode);
    if (!multiplier)
        buffer.format("{}", fixedSize);
    else if (!fixedSize)
        buffer.format("{}*n", multiplier);
    else
        buffer.format("{}*n+{}", multiplier, fixedSize);
    return buffer.str();
}